

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O3

int CompareFsm(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,int fxdSilfVersionB,
              int fxdSilfVersionT,int iPass)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  short sVar8;
  short sVar9;
  uint uVar10;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar1 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar2 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar1 != (short)iVar2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ERROR: pass FSM","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0," - number of FSM states","");
    OutputError(ec,ptcase,&local_50,iPass,&local_1b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (*grstrmB->_vptr_GrIStream[2])();
  iVar2 = (*grstrmT->_vptr_GrIStream[2])();
  if ((short)iVar1 != (short)iVar2) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ERROR: pass FSM","");
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0," - number of FSM transitional states","");
    OutputError(ec,ptcase,&local_70,iPass,&local_1d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (*grstrmB->_vptr_GrIStream[2])();
  iVar3 = (*grstrmT->_vptr_GrIStream[2])();
  sVar8 = (short)iVar2;
  if (sVar8 != (short)iVar3) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ERROR: pass FSM","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0," - number of FSM success states","");
    OutputError(ec,ptcase,&local_90,iPass,&local_1f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = (*grstrmB->_vptr_GrIStream[2])();
  iVar3 = (*grstrmT->_vptr_GrIStream[2])();
  if ((short)iVar2 != (short)iVar3) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ERROR: pass FSM","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210," - number of FSM columns","");
    OutputError(ec,ptcase,&local_b0,iPass,&local_210,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])();
  iVar4 = (*grstrmT->_vptr_GrIStream[2])();
  sVar9 = (short)iVar3;
  if (sVar9 != (short)iVar4) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ERROR: pass FSM","");
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230," - # of glyph ranges","");
    OutputError(ec,ptcase,&local_d0,iPass,&local_230,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])();
  iVar4 = (*grstrmT->_vptr_GrIStream[2])();
  if ((short)iVar3 != (short)iVar4) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"ERROR: pass FSM","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250," - glyph range search increment","");
    OutputError(ec,ptcase,&local_f0,iPass,&local_250,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])();
  iVar4 = (*grstrmT->_vptr_GrIStream[2])();
  if ((short)iVar3 != (short)iVar4) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ERROR: pass FSM","");
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270," - glyph range search loop","");
    OutputError(ec,ptcase,&local_110,iPass,&local_270,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])();
  iVar4 = (*grstrmT->_vptr_GrIStream[2])();
  if ((short)iVar3 != (short)iVar4) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ERROR: pass FSM","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290," - glyph range search start","");
    OutputError(ec,ptcase,&local_130,iPass,&local_290,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if (0 < sVar9) {
    iVar3 = 0;
    do {
      iVar4 = (*grstrmB->_vptr_GrIStream[3])();
      iVar5 = (*grstrmT->_vptr_GrIStream[3])();
      if ((short)iVar4 != (short)iVar5) {
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"ERROR: pass FSM","");
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f0," - glyph range first","");
        OutputError(ec,ptcase,&local_350,iPass,&local_3f0,iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = (*grstrmB->_vptr_GrIStream[3])();
      iVar5 = (*grstrmT->_vptr_GrIStream[3])();
      if ((short)iVar4 != (short)iVar5) {
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"ERROR: pass FSM","");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b0," - glyph range last","");
        OutputError(ec,ptcase,&local_370,iPass,&local_2b0,iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = (*grstrmB->_vptr_GrIStream[3])();
      iVar5 = (*grstrmT->_vptr_GrIStream[3])();
      if ((short)iVar4 != (short)iVar5) {
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"ERROR: pass FSM","");
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_410," - glyph range column","");
        OutputError(ec,ptcase,&local_390,iPass,&local_410,iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = iVar3 + 1;
    } while (sVar9 != iVar3);
  }
  if (-1 < sVar8) {
    iVar3 = 0;
    do {
      uVar6 = (*grstrmB->_vptr_GrIStream[3])();
      iVar4 = (*grstrmT->_vptr_GrIStream[3])();
      if ((short)uVar6 != (short)iVar4) {
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"ERROR: pass FSM","");
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2d0," - rule map offset","");
        OutputError(ec,ptcase,&local_3b0,iPass,&local_2d0,iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = iVar3 + 1;
    } while (sVar8 + 1 != iVar3);
    if ((short)uVar6 != 0) {
      uVar6 = uVar6 & 0xffff;
      uVar10 = 0;
      do {
        iVar3 = (*grstrmB->_vptr_GrIStream[3])();
        iVar4 = (*grstrmT->_vptr_GrIStream[3])();
        if ((short)iVar3 != (short)iVar4) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ERROR: pass FSM","")
          ;
          local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_430," - rule map item","");
          OutputError(ec,ptcase,&local_150,iPass,&local_430,uVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p != &local_430.field_2) {
            operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
      goto LAB_0010a41d;
    }
  }
  uVar6 = 0;
LAB_0010a41d:
  uVar10 = (*grstrmB->_vptr_GrIStream[1])();
  iVar3 = (*grstrmT->_vptr_GrIStream[1])();
  if ((byte)uVar10 != (byte)iVar3) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ERROR: pass FSM","");
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0," - min rule pre-context","");
    OutputError(ec,ptcase,&local_170,iPass,&local_2f0,uVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  uVar7 = (*grstrmB->_vptr_GrIStream[1])();
  iVar3 = (*grstrmT->_vptr_GrIStream[1])();
  if ((byte)uVar7 != (byte)iVar3) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"ERROR: pass FSM","");
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_310," - max rule pre-context","");
    OutputError(ec,ptcase,&local_190,iPass,&local_310,uVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  if ((byte)uVar10 <= (byte)uVar7) {
    iVar3 = 0;
    do {
      iVar4 = (*grstrmB->_vptr_GrIStream[2])();
      iVar5 = (*grstrmT->_vptr_GrIStream[2])();
      if ((short)iVar4 != (short)iVar5) {
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"ERROR: pass FSM","");
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330," - start state","");
        OutputError(ec,ptcase,&local_3d0,iPass,&local_330,iVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = iVar3 + 1;
    } while (((uVar7 & 0xff) - (uVar10 & 0xff)) + 1 != iVar3);
  }
  return (int)(short)iVar1 * (int)(short)iVar2;
}

Assistant:

int CompareFsm(int & ec, TestCase * ptcase,
	GrIStream & grstrmB, GrIStream & grstrmT,
	int fxdSilfVersionB, int fxdSilfVersionT, int iPass)
{
	//	number of FSM states
	int crow = grstrmB.ReadShortFromFont();
	if (crow != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM states");
	//	number of transitional states
	int crowTransitional = grstrmB.ReadShortFromFont();
	if (crowTransitional != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM transitional states");
	//	number of success states
	int crowSuccess = grstrmB.ReadShortFromFont();
	if (crowSuccess != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM success states");
	int crowFinal = crow - crowTransitional;
	int crowNonAcpt = crow - crowSuccess;

	//	number of columns
	int ccol = grstrmB.ReadShortFromFont();
	if (ccol != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM columns");

	// Sanity check
	Assert(crowTransitional <= crow && crowSuccess <= crow);

	//	number of FSM glyph ranges and search constants
	int cmcr = grstrmB.ReadShortFromFont();
	if (cmcr != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - # of glyph ranges");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search increment");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search loop");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search start");

	for (int imcr = 0; imcr < cmcr; imcr++)
	{
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range first", imcr);
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range last", imcr);
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range column", imcr);
	}

	// rule map and offsets (extra item at end gives final offset, ie, total)
	int crulInMap;
	int i;
	for (i = 0; i < (crowSuccess + 1); i++)
	{
		crulInMap = grstrmB.ReadUShortFromFont();	// last offset functions as the total length of the rule list
		if (crulInMap != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - rule map offset", i);
	}

	for (i = 0; i < crulInMap; i++)
	{
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - rule map item", i);
	}

	//	min rule pre-context number of items
	int critMinRulePreContext = grstrmB.ReadByteFromFont();
	if (critMinRulePreContext != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - min rule pre-context", i);
	int critMaxRulePreContext = grstrmB.ReadByteFromFont();
	if (critMaxRulePreContext != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - max rule pre-context", i);

	Assert(critMinRulePreContext <= kMaxSlotsPerRule);
	Assert(critMaxRulePreContext <= kMaxSlotsPerRule);

	int cStartStates = critMaxRulePreContext - critMinRulePreContext + 1;

	//	start states
	for (int ic = 0; ic < cStartStates;	ic++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - start state", ic);
	}

	return (crow - crowFinal) * ccol;
}